

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void Memory::Recycler::WBSetBit(char *addr)

{
  HeapBlock *pHVar1;
  HeapBlock *heapBlock;
  Recycler *recycler;
  AutoCriticalSection lock;
  char *addr_local;
  
  if (((DAT_01eca37e & 1) != 0) && ((DAT_01eca37f & 1) != 0)) {
    lock.cs = (CriticalSection *)addr;
    AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&recycler,&recyclerListLock);
    for (heapBlock = (HeapBlock *)recyclerList; heapBlock != (HeapBlock *)0x0;
        heapBlock = *(HeapBlock **)&heapBlock[0xb36].heapBlockType) {
      pHVar1 = FindHeapBlock((Recycler *)heapBlock,(void *)((ulong)lock.cs & 0xfffffffffffffff0));
      if (pHVar1 != (HeapBlock *)0x0) {
        (**pHVar1->_vptr_HeapBlock)(pHVar1,lock.cs);
        break;
      }
    }
    AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&recycler);
  }
  return;
}

Assistant:

void
Recycler::WBSetBit(char* addr)
{
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        AutoCriticalSection lock(&recyclerListLock);
        Recycler* recycler = Recycler::recyclerList;
        while (recycler)
        {
            auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
            if (heapBlock)
            {
                heapBlock->WBSetBit(addr);
                break;
            }
            recycler = recycler->next;
        }
    }
}